

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::treeFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  bool bVar1;
  uint32_t uVar2;
  NodeRef node;
  long *in_RDI;
  uint32_t i;
  NodeRef child;
  uint32_t offset;
  interval<unsigned_long> ival;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  NodeRef in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  interval<unsigned_long> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  long *plVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar4;
  int local_3c;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  IntervalMapDetails::
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>::find
            ((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
              *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90);
  setRoot((const_iterator *)in_stack_ffffffffffffff80.pip.value,in_stack_ffffffffffffff7c);
  bVar1 = valid((const_iterator *)0x531cb5);
  if (bVar1) {
    plVar3 = in_RDI + 1;
    IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff80.pip.value);
    IntervalMapDetails::Path::childAt((Path *)in_stack_ffffffffffffff90,uVar2);
    iVar4 = *(int *)(*in_RDI + 0xc0);
    uVar2 = IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff80.pip.value);
    local_3c = iVar4 - uVar2;
    while( true ) {
      uVar2 = (uint32_t)((ulong)plVar3 >> 0x20);
      local_3c = local_3c + -1;
      if (local_3c == 0) break;
      in_stack_ffffffffffffff90 =
           (interval<unsigned_long> *)
           IntervalMapDetails::NodeRef::
           get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                     ((NodeRef *)in_stack_ffffffffffffff80.pip.value);
      IntervalMapDetails::NodeRef::size((NodeRef *)0x531d3a);
      IntervalMapDetails::
      NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>::
      find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
            *)CONCAT44(iVar4,in_stack_ffffffffffffffa0),(uint32_t)((ulong)plVar3 >> 0x20),
           in_stack_ffffffffffffff90);
      IntervalMapDetails::Path::push
                ((Path *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff80,0);
      IntervalMapDetails::NodeRef::childAt
                ((NodeRef *)in_stack_ffffffffffffff80.pip.value,in_stack_ffffffffffffff7c);
    }
    node.pip.value =
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
         IntervalMapDetails::NodeRef::
         get<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                   ((NodeRef *)in_stack_ffffffffffffff80.pip.value);
    IntervalMapDetails::NodeRef::size((NodeRef *)0x531dd9);
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
    ::find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
            *)CONCAT44(iVar4,in_stack_ffffffffffffffa0),uVar2,in_stack_ffffffffffffff90);
    IntervalMapDetails::Path::push
              ((Path *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),node,0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::const_iterator::treeFind(TKey left, TKey right) {
    using namespace IntervalMapDetails;
    SLANG_ASSERT(!isFlat());

    interval<TKey> ival{left, right};
    uint32_t offset = map->rootBranch.find(map->rootSize, ival);
    if (offset)
        offset--;
    setRoot(offset);

    if (valid()) {
        auto child = path.childAt(path.height());
        for (uint32_t i = map->height - path.height() - 1; i > 0; i--) {
            offset = child.template get<Branch>().find(child.size(), ival);
            if (offset)
                offset--;
            path.push(child, offset);
            child = child.childAt(offset);
        }

        path.push(child, child.template get<Leaf>().find(child.size(), ival));
    }
}